

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Prim::set_primdata<tinyusdz::BlendShape>(Prim *this,BlendShape *prim)

{
  BlendShape *p;
  allocator local_109;
  string local_108;
  Path local_e8;
  BlendShape *local_18;
  BlendShape *prim_local;
  Prim *this_local;
  
  local_18 = prim;
  prim_local = (BlendShape *)this;
  tinyusdz::value::Value::operator=(&this->_data,prim);
  p = local_18;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_108,"",&local_109);
  Path::Path(&local_e8,&p->name,&local_108);
  Path::operator=(&this->_elementPath,&local_e8);
  Path::~Path(&local_e8);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return;
}

Assistant:

void set_primdata(const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    // Use prim.name for elementName
    _elementPath = Path(prim.name, "");
  }